

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O1

LocalGet * __thiscall
wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::getCopy
          (LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *this,
          LocalSet *set)

{
  Id IVar1;
  LocalGet *pLVar2;
  LocalGet *pLVar3;
  LocalGet *pLVar4;
  
  pLVar2 = (LocalGet *)set->value;
  IVar1 = (pLVar2->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id;
  if (IVar1 == LocalGetId) {
    return pLVar2;
  }
  if (IVar1 == IfId) {
    pLVar3 = *(LocalGet **)
              &pLVar2[1].super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression;
    pLVar4 = (LocalGet *)0x0;
    if ((pLVar3->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id ==
        LocalGetId) {
      pLVar4 = pLVar3;
    }
    if (pLVar4 != (LocalGet *)0x0) {
      return pLVar4;
    }
    pLVar2 = (LocalGet *)
             pLVar2[1].super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression.type.id;
    if (pLVar2 != (LocalGet *)0x0) {
      if ((pLVar2->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id !=
          LocalGetId) {
        return (LocalGet *)0x0;
      }
      return pLVar2;
    }
  }
  return (LocalGet *)0x0;
}

Assistant:

LocalGet* getCopy(LocalSet* set) {
    if (auto* get = set->value->dynCast<LocalGet>()) {
      return get;
    }
    if (auto* iff = set->value->dynCast<If>()) {
      if (auto* get = iff->ifTrue->dynCast<LocalGet>()) {
        return get;
      }
      if (iff->ifFalse) {
        if (auto* get = iff->ifFalse->dynCast<LocalGet>()) {
          return get;
        }
      }
    }
    return nullptr;
  }